

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_testFailureWithQuotesInIt_TestShell::
~TEST_JUnitOutputTest_testFailureWithQuotesInIt_TestShell
          (TEST_JUnitOutputTest_testFailureWithQuotesInIt_TestShell *this)

{
  TEST_JUnitOutputTest_testFailureWithQuotesInIt_TestShell *this_local;
  
  ~TEST_JUnitOutputTest_testFailureWithQuotesInIt_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, testFailureWithQuotesInIt)
{
    testCaseRunner->start()
            .withGroup("testGroupWithFailingTest")
                .withTest("FailingTestName").thatFails("Test \"failed\"", "thisfile", 10)
            .end();

    outputFile = fileSystem.file("cpputest_testGroupWithFailingTest.xml");

    STRCMP_EQUAL("<failure message=\"thisfile:10: Test &quot;failed&quot;\" type=\"AssertionFailedError\">\n", outputFile->line(6));
}